

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O0

void __thiscall QtConcurrent::ThreadEngineBase::run(ThreadEngineBase *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  QException *e;
  ThreadEngineBase *in_stack_ffffffffffffff98;
  ThreadEngineBase *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isCanceled(in_stack_ffffffffffffff98);
  if (bVar2) {
    threadExit(in_stack_ffffffffffffffa0);
  }
  else {
    startThreads(in_stack_ffffffffffffffa0);
    while (iVar3 = (**(code **)(*in_RDI + 0x28))(), iVar3 == 0) {
      bVar2 = threadThrottleExit((ThreadEngineBase *)0x104564);
      if (bVar2) goto LAB_001045c7;
      reportIfSuspensionDone(in_stack_ffffffffffffffa0);
    }
    threadExit(in_stack_ffffffffffffffa0);
  }
LAB_001045c7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ThreadEngineBase::run() // implements QRunnable.
{
    if (this->isCanceled()) {
        threadExit();
        return;
    }

    startThreads();

#ifndef QT_NO_EXCEPTIONS
    try {
#endif
        while (threadFunction() == ThrottleThread) {
            // threadFunction returning ThrottleThread means it that the user
            // struct wants to be throttled by making a worker thread exit.
            // Respect that request unless this is the only worker thread left
            // running, in which case it has to keep going.
            if (threadThrottleExit()) {
                return;
            } else {
                // If the last worker thread is throttled and the state is "suspending",
                // it means that suspension has been requested, and it is already
                // in effect (because all previous threads have already exited).
                // Report the "Suspended" state.
                reportIfSuspensionDone();
            }
        }

#ifndef QT_NO_EXCEPTIONS
    } catch (QException &e) {
        handleException(e);
    } catch (...) {
        handleException(QUnhandledException(std::current_exception()));
    }
#endif
    threadExit();
}